

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O3

StringTree * __thiscall
kj::
strTree<char_const(&)[17],kj::StringTree,char_const(&)[7],kj::StringPtr&,char_const(&)[32],kj::StringPtr&,char_const(&)[183],kj::Array<kj::StringTree>,char_const(&)[192]>
          (StringTree *__return_storage_ptr__,kj *this,char (*params) [17],StringTree *params_1,
          char (*params_2) [7],StringPtr *params_3,char (*params_4) [32],StringPtr *params_5,
          char (*params_6) [183],Array<kj::StringTree> *params_7,char (*params_8) [192])

{
  char *pcVar1;
  size_t sVar2;
  Branch *pBVar3;
  StringPtr delim;
  ArrayPtr<const_char> local_d8;
  undefined1 local_c8 [24];
  ArrayDisposer *local_b0;
  StringTree local_a8;
  undefined1 local_70 [24];
  ArrayDisposer *local_58;
  ArrayPtr<const_char> local_50;
  ArrayPtr<const_char> local_40;
  
  local_b0 = (ArrayDisposer *)strlen((char *)this);
  local_c8._16_8_ = this;
  local_c8._8_8_ = strlen((char *)params_1);
  local_d8.ptr = *(char **)params_2;
  local_d8.size_ = *(long *)(params_2[1] + 1) - 1;
  local_c8._0_8_ = params_1;
  local_40.size_ = strlen((char *)params_3);
  local_50.ptr = *(char **)*params_4;
  local_50.size_ = *(long *)(*params_4 + 8) - 1;
  local_40.ptr = (char *)params_3;
  local_58 = (ArrayDisposer *)strlen((char *)params_5);
  local_70._16_8_ = params_5;
  delim.content.size_ = 1;
  delim.content.ptr = "";
  StringTree::StringTree(&local_a8,(Array<kj::StringTree> *)params_6,delim);
  local_70._8_8_ = strlen((char *)params_7);
  local_70._0_8_ = params_7;
  StringTree::
  concat<kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(StringTree *)(local_c8 + 0x10),(ArrayPtr<const_char> *)params,
             (StringTree *)local_c8,&local_d8,&local_40,&local_50,
             (ArrayPtr<const_char> *)(local_70 + 0x10),(ArrayPtr<const_char> *)&local_a8,
             (StringTree *)local_70,(ArrayPtr<const_char> *)__return_storage_ptr__);
  sVar2 = local_a8.branches.size_;
  pBVar3 = local_a8.branches.ptr;
  if (local_a8.branches.ptr != (Branch *)0x0) {
    local_a8.branches.ptr = (Branch *)0x0;
    local_a8.branches.size_ = 0;
    (**(local_a8.branches.disposer)->_vptr_ArrayDisposer)
              (local_a8.branches.disposer,pBVar3,0x40,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  sVar2 = local_a8.text.content.size_;
  pcVar1 = local_a8.text.content.ptr;
  if (local_a8.text.content.ptr != (char *)0x0) {
    local_a8.text.content.ptr = (char *)0x0;
    local_a8.text.content.size_ = 0;
    (**(local_a8.text.content.disposer)->_vptr_ArrayDisposer)
              (local_a8.text.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}